

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Promise<void> * __thiscall
kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
          (NullableValue<kj::Promise<void>> *this,Promise<void> *params)

{
  PromiseNode *pPVar1;
  
  if (*this == (NullableValue<kj::Promise<void>>)0x1) {
    *this = (NullableValue<kj::Promise<void>>)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(this + 8));
  }
  pPVar1 = (params->super_PromiseBase).node.ptr;
  *(Disposer **)(this + 8) = (params->super_PromiseBase).node.disposer;
  *(PromiseNode **)(this + 0x10) = pPVar1;
  (params->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *this = (NullableValue<kj::Promise<void>>)0x1;
  return (Promise<void> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }